

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

float memory_tree_ns::normalized_linear_prod(memory_tree *b,example *ec1,example *ec2)

{
  flat_example *fec1;
  flat_example *fec2;
  float fVar1;
  float fVar2;
  
  fec1 = flatten_sort_example(b->all,ec1);
  fec2 = flatten_sort_example(b->all,ec2);
  fVar1 = powf(fec1->total_sum_feat_sq * fec2->total_sum_feat_sq,0.5);
  fVar2 = linear_kernel(fec1,fec2);
  free_flatten_example(fec1);
  free_flatten_example(fec2);
  return fVar2 / fVar1;
}

Assistant:

float normalized_linear_prod(memory_tree& b, example* ec1, example* ec2)
    {
        flat_example* fec1 = flatten_sort_example(*b.all, ec1);
        flat_example* fec2 = flatten_sort_example(*b.all, ec2);
        float norm_sqrt = pow(fec1->total_sum_feat_sq*fec2->total_sum_feat_sq, 0.5f);
        float linear_prod = linear_kernel(fec1, fec2);
        //fec1->fs.delete_v(); 
        //fec2->fs.delete_v();
        free_flatten_example(fec1);
        free_flatten_example(fec2);
        return linear_prod/norm_sqrt;
    }